

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateHandler.cxx
# Opt level: O2

int __thiscall cmCTestUpdateHandler::ProcessHandler(cmCTestUpdateHandler *this)

{
  cmCTest **__args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  int iVar1;
  cmCTest *pcVar2;
  bool bVar3;
  bool bVar4;
  cmValue dir;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  char *pcVar9;
  int iVar10;
  string end_time;
  allocator<char> local_7b9;
  string changeId;
  string local_798;
  cmXMLWriter xml;
  ostringstream cmCTestLog_msg_3;
  time_point start_time_time;
  string local_590;
  string buildname;
  string start_time;
  cmCLocaleEnvironmentScope fixLocale;
  cmGeneratedFileStream os;
  cmGeneratedFileStream ofs;
  
  cmCLocaleEnvironmentScope::cmCLocaleEnvironmentScope(&fixLocale);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ofs,"SourceDirectory",(allocator<char> *)&os);
  dir = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)&ofs);
  std::__cxx11::string::~string((string *)&ofs);
  if (dir.Value == (string *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ofs);
    poVar5 = std::operator<<((ostream *)&ofs,
                             "Cannot find SourceDirectory  key in the DartConfiguration.tcl");
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                 ,0x74,(char *)os.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                               _vptr_basic_ostream,false);
    std::__cxx11::string::~string((string *)&os);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ofs);
    iVar10 = -1;
  }
  else {
    cmGeneratedFileStream::cmGeneratedFileStream(&ofs,None);
    bVar3 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
    if (!bVar3) {
      cmCTestGenericHandler::StartLogFile(&this->super_cmCTestGenericHandler,"Update",&ofs);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
    poVar5 = std::operator<<((ostream *)&os,"   Updating the repository: ");
    poVar5 = std::operator<<(poVar5,(string *)dir.Value);
    std::endl<char,std::char_traits<char>>(poVar5);
    __args_1 = &(this->super_cmCTestGenericHandler).CTest;
    pcVar2 = *__args_1;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                 ,0x80,_cmCTestLog_msg_3,(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
    bVar3 = SelectVCS(this);
    if (bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
      poVar5 = std::operator<<((ostream *)&os,"   Use ");
      if ((ulong)(uint)this->UpdateType < 7) {
        pcVar9 = cmCTestUpdateHandlerUpdateStrings[(uint)this->UpdateType];
      }
      else {
        pcVar9 = "Unknown";
      }
      poVar5 = std::operator<<(poVar5,pcVar9);
      poVar5 = std::operator<<(poVar5," repository type");
      std::endl<char,std::char_traits<char>>(poVar5);
      pcVar2 = *__args_1;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                   ,0x8a,_cmCTestLog_msg_3,(this->super_cmCTestGenericHandler).Quiet);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
      switch(this->UpdateType) {
      case 1:
        std::make_unique<cmCTestCVS,cmCTest*&,cmGeneratedFileStream&>
                  ((cmCTest **)&os,(cmGeneratedFileStream *)__args_1);
        break;
      case 2:
        std::make_unique<cmCTestSVN,cmCTest*&,cmGeneratedFileStream&>
                  ((cmCTest **)&os,(cmGeneratedFileStream *)__args_1);
        break;
      case 3:
        std::make_unique<cmCTestBZR,cmCTest*&,cmGeneratedFileStream&>
                  ((cmCTest **)&os,(cmGeneratedFileStream *)__args_1);
        break;
      case 4:
        std::make_unique<cmCTestGIT,cmCTest*&,cmGeneratedFileStream&>
                  ((cmCTest **)&os,(cmGeneratedFileStream *)__args_1);
        break;
      case 5:
        std::make_unique<cmCTestHG,cmCTest*&,cmGeneratedFileStream&>
                  ((cmCTest **)&os,(cmGeneratedFileStream *)__args_1);
        break;
      case 6:
        std::make_unique<cmCTestP4,cmCTest*&,cmGeneratedFileStream&>
                  ((cmCTest **)&os,(cmGeneratedFileStream *)__args_1);
        break;
      default:
        std::make_unique<cmCTestVC,cmCTest*&,cmGeneratedFileStream&>
                  ((cmCTest **)&os,(cmGeneratedFileStream *)__args_1);
      }
      cmCTestVC::SetCommandLineTool
                ((cmCTestVC *)
                 os.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                 _vptr_basic_ostream,&this->UpdateCommand);
      cmCTestVC::SetSourceDirectory
                ((cmCTestVC *)
                 os.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                 _vptr_basic_ostream,dir.Value);
      cmCTestVC::Cleanup((cmCTestVC *)
                         os.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream);
      cmGeneratedFileStream::cmGeneratedFileStream(&os,None);
      bVar3 = cmCTestGenericHandler::StartResultingXML
                        (&this->super_cmCTestGenericHandler,PartUpdate,"Update",&os);
      if (bVar3) {
        cmCTest::CurrentTime_abi_cxx11_(&start_time,*__args_1);
        start_time_time.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        lVar6 = std::chrono::_V2::steady_clock::now();
        bVar3 = cmCTestVC::Update((cmCTestVC *)
                                  os.super_ofstream.
                                  super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream);
        pcVar2 = *__args_1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&xml,"BuildName",(allocator<char> *)&changeId);
        cmCTest::GetCTestConfiguration((string *)&cmCTestLog_msg_3,pcVar2,(string *)&xml);
        cmCTest::SafeBuildIdField(&buildname,(string *)&cmCTestLog_msg_3);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        std::__cxx11::string::~string((string *)&xml);
        cmXMLWriter::cmXMLWriter(&xml,(ostream *)&os,0);
        cmXMLWriter::StartDocument(&xml,"UTF-8");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCTestLog_msg_3,"Update",(allocator<char> *)&changeId);
        cmXMLWriter::StartElement(&xml,(string *)&cmCTestLog_msg_3);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        cmXMLWriter::Attribute<char[7]>(&xml,"mode",(char (*) [7])0x786a91);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&changeId,"ctest-",(allocator<char> *)&end_time);
        pcVar9 = cmVersion::GetCMakeVersion();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cmCTestLog_msg_3,&changeId,pcVar9);
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (&xml,"Generator",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCTestLog_msg_3);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        std::__cxx11::string::~string((string *)&changeId);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCTestLog_msg_3,"Site",(allocator<char> *)&local_798);
        pcVar2 = *__args_1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&end_time,"Site",(allocator<char> *)&local_590);
        cmCTest::GetCTestConfiguration(&changeId,pcVar2,&end_time);
        cmXMLWriter::Element<std::__cxx11::string>(&xml,(string *)&cmCTestLog_msg_3,&changeId);
        std::__cxx11::string::~string((string *)&changeId);
        std::__cxx11::string::~string((string *)&end_time);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCTestLog_msg_3,"BuildName",(allocator<char> *)&changeId);
        cmXMLWriter::Element<std::__cxx11::string>(&xml,(string *)&cmCTestLog_msg_3,&buildname);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCTestLog_msg_3,"BuildStamp",&local_7b9);
        cmCTest::GetCurrentTag_abi_cxx11_(&local_798,*__args_1);
        std::operator+(&end_time,&local_798,"-");
        cmCTest::GetTestModelString_abi_cxx11_(&local_590,*__args_1);
        std::operator+(&changeId,&end_time,&local_590);
        cmXMLWriter::Element<std::__cxx11::string>(&xml,(string *)&cmCTestLog_msg_3,&changeId);
        std::__cxx11::string::~string((string *)&changeId);
        std::__cxx11::string::~string((string *)&local_590);
        std::__cxx11::string::~string((string *)&end_time);
        std::__cxx11::string::~string((string *)&local_798);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCTestLog_msg_3,"StartDateTime",(allocator<char> *)&changeId);
        cmXMLWriter::Element<std::__cxx11::string>(&xml,(string *)&cmCTestLog_msg_3,&start_time);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCTestLog_msg_3,"StartTime",(allocator<char> *)&changeId);
        cmXMLWriter::
        Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                  (&xml,(string *)&cmCTestLog_msg_3,&start_time_time);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCTestLog_msg_3,"UpdateCommand",(allocator<char> *)&changeId);
        value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (os.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                 _vptr_basic_ostream + 0xb);
        cmXMLWriter::Element<std::__cxx11::string>(&xml,(string *)&cmCTestLog_msg_3,value);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCTestLog_msg_3,"UpdateType",(allocator<char> *)&end_time);
        if ((ulong)(uint)this->UpdateType < 7) {
          changeId._M_dataplus._M_p = cmCTestUpdateHandlerUpdateStrings[(uint)this->UpdateType];
        }
        else {
          changeId._M_dataplus._M_p = "Unknown";
        }
        cmXMLWriter::Element<char_const*>(&xml,(string *)&cmCTestLog_msg_3,(char **)&changeId);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        pcVar2 = *__args_1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCTestLog_msg_3,"ChangeId",(allocator<char> *)&end_time);
        cmCTest::GetCTestConfiguration(&changeId,pcVar2,(string *)&cmCTestLog_msg_3);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        if (changeId._M_string_length != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cmCTestLog_msg_3,"ChangeId",(allocator<char> *)&end_time);
          cmXMLWriter::Element<std::__cxx11::string>(&xml,(string *)&cmCTestLog_msg_3,&changeId);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        }
        bVar4 = cmCTestVC::WriteXML((cmCTestVC *)
                                    os.super_ofstream.
                                    super_basic_ostream<char,_std::char_traits<char>_>.
                                    _vptr_basic_ostream,&xml);
        iVar10 = *(int *)(os.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream + 0x2f);
        if (iVar10 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_3);
          poVar5 = std::operator<<((ostream *)&cmCTestLog_msg_3,"   Found ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar10);
          std::operator<<(poVar5," updated files\n");
          pcVar2 = *__args_1;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                       ,0xd8,end_time._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&end_time);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_3);
        }
        iVar8 = *(int *)((long)os.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                               _vptr_basic_ostream + 0x17c);
        if (iVar8 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_3);
          poVar5 = std::operator<<((ostream *)&cmCTestLog_msg_3,"   Found ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar8);
          std::operator<<(poVar5," locally modified files\n");
          pcVar2 = *__args_1;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                       ,0xdd,end_time._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&end_time);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_3);
        }
        iVar1 = *(int *)(os.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream + 0x30);
        if (iVar1 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_3);
          poVar5 = std::operator<<((ostream *)&cmCTestLog_msg_3,"   Found ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
          std::operator<<(poVar5," conflicting files\n");
          pcVar2 = *__args_1;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                       ,0xe3,end_time._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&end_time);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_3);
          iVar8 = iVar8 + iVar1;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_3);
        poVar5 = std::operator<<((ostream *)&cmCTestLog_msg_3,"End");
        std::endl<char,std::char_traits<char>>(poVar5);
        pcVar2 = *__args_1;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                     ,0xe7,end_time._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&end_time);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_3);
        cmCTest::CurrentTime_abi_cxx11_(&end_time,*__args_1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCTestLog_msg_3,"EndDateTime",(allocator<char> *)&local_798);
        cmXMLWriter::Element<std::__cxx11::string>(&xml,(string *)&cmCTestLog_msg_3,&end_time);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCTestLog_msg_3,"EndTime",(allocator<char> *)&local_590);
        local_798._M_dataplus._M_p = (pointer)std::chrono::_V2::system_clock::now();
        cmXMLWriter::
        Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                  (&xml,(string *)&cmCTestLog_msg_3,
                   (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)&local_798);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCTestLog_msg_3,"ElapsedMinutes",(allocator<char> *)&local_590);
        lVar7 = std::chrono::_V2::steady_clock::now();
        local_798._M_dataplus._M_p = (pointer)((lVar7 - lVar6) / 60000000000);
        cmXMLWriter::Element<long>(&xml,(string *)&cmCTestLog_msg_3,(long *)&local_798);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCTestLog_msg_3,"UpdateReturnStatus",(allocator<char> *)&local_798);
        cmXMLWriter::StartElement(&xml,(string *)&cmCTestLog_msg_3);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        if (iVar8 != 0) {
          cmXMLWriter::Content<char[72]>
                    (&xml,(char (*) [72])
                          "Update error: There are modified or conflicting files in the repository")
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_3);
          poVar5 = std::operator<<((ostream *)&cmCTestLog_msg_3,
                                   "   There are modified or conflicting files in the repository");
          std::endl<char,std::char_traits<char>>(poVar5);
          pcVar2 = *__args_1;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                       ,0xf6,local_798._M_dataplus._M_p,false);
          std::__cxx11::string::~string((string *)&local_798);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_3);
        }
        if (!bVar3) {
          cmXMLWriter::Content<char[24]>(&xml,(char (*) [24])"Update command failed:\n");
          cmXMLWriter::Content<std::__cxx11::string>(&xml,value);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_3);
          poVar5 = std::operator<<((ostream *)&cmCTestLog_msg_3,"   Update command failed: ");
          poVar5 = std::operator<<(poVar5,(string *)value);
          std::operator<<(poVar5,"\n");
          pcVar2 = *__args_1;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                       ,0xfd,local_798._M_dataplus._M_p,false);
          std::__cxx11::string::~string((string *)&local_798);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_3);
        }
        cmXMLWriter::EndElement(&xml);
        cmXMLWriter::EndElement(&xml);
        cmXMLWriter::EndDocument(&xml);
        if (!bVar4) {
          iVar10 = -1;
        }
        if (!bVar3) {
          iVar10 = -1;
        }
        std::__cxx11::string::~string((string *)&end_time);
        std::__cxx11::string::~string((string *)&changeId);
        cmXMLWriter::~cmXMLWriter(&xml);
        std::__cxx11::string::~string((string *)&buildname);
        std::__cxx11::string::~string((string *)&start_time);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_3);
        poVar5 = std::operator<<((ostream *)&cmCTestLog_msg_3,"Cannot open log file");
        std::endl<char,std::char_traits<char>>(poVar5);
        pcVar2 = *__args_1;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                     ,0xb1,(char *)xml.Output,false);
        std::__cxx11::string::~string((string *)&xml);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_3);
        iVar10 = -1;
      }
      cmGeneratedFileStream::~cmGeneratedFileStream(&os);
      (**(code **)(*os.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream + 8))
                (os.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                 _vptr_basic_ostream);
    }
    else {
      iVar10 = -1;
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&ofs);
  }
  cmCLocaleEnvironmentScope::~cmCLocaleEnvironmentScope(&fixLocale);
  return iVar10;
}

Assistant:

int cmCTestUpdateHandler::ProcessHandler()
{
  // Make sure VCS tool messages are in English so we can parse them.
  cmCLocaleEnvironmentScope fixLocale;
  static_cast<void>(fixLocale);

  // Get source dir
  cmValue sourceDirectory = this->GetOption("SourceDirectory");
  if (!sourceDirectory) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find SourceDirectory  key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  cmGeneratedFileStream ofs;
  if (!this->CTest->GetShowOnly()) {
    this->StartLogFile("Update", ofs);
  }

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "   Updating the repository: " << *sourceDirectory
                                                    << std::endl,
                     this->Quiet);

  if (!this->SelectVCS()) {
    return -1;
  }

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "   Use "
                       << cmCTestUpdateHandlerUpdateToString(this->UpdateType)
                       << " repository type" << std::endl;
                     , this->Quiet);

  // Create an object to interact with the VCS tool.
  std::unique_ptr<cmCTestVC> vc;
  switch (this->UpdateType) {
    case e_CVS:
      vc = cm::make_unique<cmCTestCVS>(this->CTest, ofs);
      break;
    case e_SVN:
      vc = cm::make_unique<cmCTestSVN>(this->CTest, ofs);
      break;
    case e_BZR:
      vc = cm::make_unique<cmCTestBZR>(this->CTest, ofs);
      break;
    case e_GIT:
      vc = cm::make_unique<cmCTestGIT>(this->CTest, ofs);
      break;
    case e_HG:
      vc = cm::make_unique<cmCTestHG>(this->CTest, ofs);
      break;
    case e_P4:
      vc = cm::make_unique<cmCTestP4>(this->CTest, ofs);
      break;
    default:
      vc = cm::make_unique<cmCTestVC>(this->CTest, ofs);
      break;
  }
  vc->SetCommandLineTool(this->UpdateCommand);
  vc->SetSourceDirectory(*sourceDirectory);

  // Cleanup the working tree.
  vc->Cleanup();

  //
  // Now update repository and remember what files were updated
  //
  cmGeneratedFileStream os;
  if (!this->StartResultingXML(cmCTest::PartUpdate, "Update", os)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot open log file" << std::endl);
    return -1;
  }
  std::string start_time = this->CTest->CurrentTime();
  auto start_time_time = std::chrono::system_clock::now();
  auto elapsed_time_start = std::chrono::steady_clock::now();

  bool updated = vc->Update();
  std::string buildname =
    cmCTest::SafeBuildIdField(this->CTest->GetCTestConfiguration("BuildName"));

  cmXMLWriter xml(os);
  xml.StartDocument();
  xml.StartElement("Update");
  xml.Attribute("mode", "Client");
  xml.Attribute("Generator",
                std::string("ctest-") + cmVersion::GetCMakeVersion());
  xml.Element("Site", this->CTest->GetCTestConfiguration("Site"));
  xml.Element("BuildName", buildname);
  xml.Element("BuildStamp",
              this->CTest->GetCurrentTag() + "-" +
                this->CTest->GetTestModelString());
  xml.Element("StartDateTime", start_time);
  xml.Element("StartTime", start_time_time);
  xml.Element("UpdateCommand", vc->GetUpdateCommandLine());
  xml.Element("UpdateType",
              cmCTestUpdateHandlerUpdateToString(this->UpdateType));
  std::string changeId = this->CTest->GetCTestConfiguration("ChangeId");
  if (!changeId.empty()) {
    xml.Element("ChangeId", changeId);
  }

  bool loadedMods = vc->WriteXML(xml);

  int localModifications = 0;
  int numUpdated = vc->GetPathCount(cmCTestVC::PathUpdated);
  if (numUpdated) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Found " << numUpdated << " updated files\n",
                       this->Quiet);
  }
  if (int numModified = vc->GetPathCount(cmCTestVC::PathModified)) {
    cmCTestOptionalLog(
      this->CTest, HANDLER_OUTPUT,
      "   Found " << numModified << " locally modified files\n", this->Quiet);
    localModifications += numModified;
  }
  if (int numConflicting = vc->GetPathCount(cmCTestVC::PathConflicting)) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Found " << numConflicting << " conflicting files\n",
                       this->Quiet);
    localModifications += numConflicting;
  }

  cmCTestOptionalLog(this->CTest, DEBUG, "End" << std::endl, this->Quiet);
  std::string end_time = this->CTest->CurrentTime();
  xml.Element("EndDateTime", end_time);
  xml.Element("EndTime", std::chrono::system_clock::now());
  xml.Element("ElapsedMinutes",
              std::chrono::duration_cast<std::chrono::minutes>(
                std::chrono::steady_clock::now() - elapsed_time_start)
                .count());

  xml.StartElement("UpdateReturnStatus");
  if (localModifications) {
    xml.Content("Update error: "
                "There are modified or conflicting files in the repository");
    cmCTestLog(this->CTest, WARNING,
               "   There are modified or conflicting files in the repository"
                 << std::endl);
  }
  if (!updated) {
    xml.Content("Update command failed:\n");
    xml.Content(vc->GetUpdateCommandLine());
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               "   Update command failed: " << vc->GetUpdateCommandLine()
                                            << "\n");
  }
  xml.EndElement(); // UpdateReturnStatus
  xml.EndElement(); // Update
  xml.EndDocument();
  return updated && loadedMods ? numUpdated : -1;
}